

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

LongLong __thiscall
cmsys::SystemInformationImplementation::GetProcMemoryAvailable
          (SystemInformationImplementation *this,char *hostLimitEnvVarName,char *procLimitEnvVarName
          )

{
  char *__nptr;
  longlong a;
  undefined1 local_50 [8];
  ResourceLimitType rlim;
  int ierr;
  LongLong procLimit;
  char *procLimitEnvVarValue;
  LongLong memAvail;
  char *procLimitEnvVarName_local;
  char *hostLimitEnvVarName_local;
  SystemInformationImplementation *this_local;
  
  procLimitEnvVarValue = (char *)GetHostMemoryAvailable(this,hostLimitEnvVarName);
  if (((procLimitEnvVarName != (char *)0x0) &&
      (__nptr = getenv(procLimitEnvVarName), __nptr != (char *)0x0)) && (a = atoll(__nptr), 0 < a))
  {
    procLimitEnvVarValue = (char *)min<long_long>(a,(longlong)procLimitEnvVarValue);
  }
  rlim.rlim_max._4_4_ = getrlimit64(RLIMIT_DATA,(rlimit64 *)local_50);
  if ((rlim.rlim_max._4_4_ == 0) && (local_50 != (undefined1  [8])0xffffffffffffffff)) {
    procLimitEnvVarValue =
         (char *)min<long_long>((long)local_50 / 0x400,(longlong)procLimitEnvVarValue);
  }
  rlim.rlim_max._4_4_ = getrlimit64(RLIMIT_AS,(rlimit64 *)local_50);
  if ((rlim.rlim_max._4_4_ == 0) && (local_50 != (undefined1  [8])0xffffffffffffffff)) {
    procLimitEnvVarValue =
         (char *)min<long_long>((long)local_50 / 0x400,(longlong)procLimitEnvVarValue);
  }
  return (LongLong)procLimitEnvVarValue;
}

Assistant:

SystemInformation::LongLong
SystemInformationImplementation::GetProcMemoryAvailable(
        const char *hostLimitEnvVarName,
        const char *procLimitEnvVarName)
{
  SystemInformation::LongLong memAvail
    = this->GetHostMemoryAvailable(hostLimitEnvVarName);

  // the following mechanism is provide for systems where rlimits
  // are not employed. Units are in KiB.
  if (procLimitEnvVarName)
    {
    const char *procLimitEnvVarValue=getenv(procLimitEnvVarName);
    if (procLimitEnvVarValue)
      {
      SystemInformation::LongLong procLimit=atoLongLong(procLimitEnvVarValue);
      if (procLimit>0)
        {
        memAvail=min(procLimit,memAvail);
        }
      }
    }

#if defined(__linux)
  int ierr;
  ResourceLimitType rlim;
  ierr=GetResourceLimit(RLIMIT_DATA,&rlim);
  if ((ierr==0) && (rlim.rlim_cur != RLIM_INFINITY))
    {
    memAvail=min((SystemInformation::LongLong)rlim.rlim_cur/1024,memAvail);
    }

  ierr=GetResourceLimit(RLIMIT_AS,&rlim);
  if ((ierr==0) && (rlim.rlim_cur != RLIM_INFINITY))
    {
    memAvail=min((SystemInformation::LongLong)rlim.rlim_cur/1024,memAvail);
    }
#elif defined(__APPLE__)
  struct rlimit rlim;
  int ierr;
  ierr=getrlimit(RLIMIT_DATA,&rlim);
  if ((ierr==0) && (rlim.rlim_cur != RLIM_INFINITY))
    {
    memAvail=min((SystemInformation::LongLong)rlim.rlim_cur/1024,memAvail);
    }

  ierr=getrlimit(RLIMIT_RSS,&rlim);
  if ((ierr==0) && (rlim.rlim_cur != RLIM_INFINITY))
    {
    memAvail=min((SystemInformation::LongLong)rlim.rlim_cur/1024,memAvail);
    }
#endif

  return memAvail;
}